

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O3

void CodeSpectralEnvelope
               (double **spectrogram,int f0_length,int fs,int fft_size,int number_of_dimensions,
               double **coded_spectral_envelope)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  fft_plan p;
  uint x_length;
  double *xi;
  double *x;
  double *y;
  double *pdVar6;
  double *yi;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  uint fft_size_00;
  ulong uVar10;
  fft_plan *pfVar11;
  ulong uVar12;
  long lVar13;
  undefined8 *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  double dVar20;
  double dVar21;
  double in_XMM2_Qa;
  ForwardRealFFT forward_real_fft;
  undefined8 auStackY_158 [5];
  undefined1 in_stack_fffffffffffffed0 [40];
  double dVar22;
  ForwardRealFFT local_98;
  
  bVar19 = 0;
  fft_size_00 = fft_size / 2;
  lVar16 = (long)(int)fft_size_00;
  uVar12 = lVar16 * 8;
  uVar15 = lVar16 << 4;
  if (fft_size < -1) {
    uVar12 = 0xffffffffffffffff;
    uVar15 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar12);
  x_length = fft_size_00 + 1;
  uVar12 = lVar16 * 8 + 8;
  if (fft_size < -3) {
    uVar12 = 0xffffffffffffffff;
  }
  x = (double *)operator_new__(uVar12);
  y = (double *)operator_new__(uVar12);
  pdVar6 = (double *)operator_new__(uVar15);
  dVar20 = (double)fs;
  dVar2 = dVar20 * 0.5;
  if (20000.0 <= dVar2) {
    dVar2 = 20000.0;
  }
  dVar2 = log(dVar2 / 700.0 + 1.0);
  dVar21 = (double)fft_size;
  uVar12 = (ulong)fft_size_00;
  if (1 < fft_size) {
    dVar3 = (double)(int)fft_size_00;
    dVar22 = SQRT(dVar21);
    pdVar8 = pdVar6 + 1;
    uVar15 = 0;
    do {
      xi[uVar15] = ((dVar2 * 1127.01048 + -62.62780462351186) * (double)(int)uVar15) / dVar3 +
                   62.62780462351186;
      dVar4 = ((double)(int)uVar15 * 3.141592653589793) / dVar21;
      dVar5 = cos(dVar4);
      pdVar8[-1] = (dVar5 + dVar5) / dVar22;
      dVar4 = sin(dVar4);
      *pdVar8 = (dVar4 + dVar4) / dVar22;
      uVar15 = uVar15 + 1;
      pdVar8 = pdVar8 + 2;
    } while (uVar12 != uVar15);
    in_XMM2_Qa = *pdVar6;
  }
  *pdVar6 = in_XMM2_Qa / 1.4142135623730951;
  uVar15 = (ulong)x_length;
  if (-2 < fft_size) {
    uVar17 = 0;
    do {
      dVar2 = log((((double)(int)uVar17 * dVar20) / dVar21) / 700.0 + 1.0);
      x[uVar17] = dVar2 * 1127.01048;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  local_98.forward_fft.ip = (int *)0x0;
  local_98.forward_fft.w = (double *)0x0;
  local_98.forward_fft.out = (double *)0x0;
  local_98.forward_fft.input = (double *)0x0;
  local_98.forward_fft.in = (double *)0x0;
  local_98.forward_fft.c_out = (fft_complex *)0x0;
  local_98.forward_fft.flags = 0;
  local_98.forward_fft._12_4_ = 0;
  local_98.forward_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.forward_fft.n = 0;
  local_98.forward_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size_00,&local_98);
  if (0 < f0_length) {
    pdVar8 = (double *)0xffffffffffffffff;
    if (-2 < fft_size) {
      pdVar8 = (double *)(uVar12 * 8);
    }
    uVar7 = fft_size_00 >> 1;
    uVar18 = (ulong)(uint)number_of_dimensions;
    uVar17 = (ulong)(uint)f0_length;
    uVar10 = 0;
    do {
      if (-2 < fft_size) {
        uVar9 = 0;
        do {
          dVar2 = log(spectrogram[uVar10][uVar9]);
          y[uVar9] = dVar2;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      pdVar1 = coded_spectral_envelope[uVar10];
      yi = (double *)operator_new__((ulong)pdVar8);
      interp1(x,y,x_length,xi,fft_size_00,yi);
      if (3 < fft_size) {
        lVar16 = 0;
        lVar13 = 0;
        do {
          *(undefined8 *)((long)local_98.waveform + lVar16) = *(undefined8 *)((long)yi + lVar16 * 2)
          ;
          *(undefined8 *)((long)local_98.waveform + lVar16 + (ulong)uVar7 * 8) =
               *(undefined8 *)((long)yi + lVar13 + uVar12 * 8 + -8);
          lVar13 = lVar13 + -0x10;
          lVar16 = lVar16 + 8;
        } while ((ulong)uVar7 * 0x10 + lVar13 != 0);
      }
      pfVar11 = &local_98.forward_fft;
      puVar14 = auStackY_158;
      for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar14 = *(undefined8 *)pfVar11;
        pfVar11 = (fft_plan *)((long)pfVar11 + ((ulong)bVar19 * -2 + 1) * 8);
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      }
      p.out._0_4_ = fft_size;
      p.n = in_stack_fffffffffffffed0._0_4_;
      p.sign = in_stack_fffffffffffffed0._4_4_;
      p.flags = in_stack_fffffffffffffed0._8_4_;
      p._12_4_ = in_stack_fffffffffffffed0._12_4_;
      p.c_in = (fft_complex *)in_stack_fffffffffffffed0._16_8_;
      p.in = (double *)in_stack_fffffffffffffed0._24_8_;
      p.c_out = (fft_complex *)in_stack_fffffffffffffed0._32_8_;
      p.out._4_4_ = fft_size_00;
      p.input._0_4_ = number_of_dimensions;
      p.input._4_4_ = x_length;
      p.ip = (int *)uVar17;
      p.w = pdVar8;
      fft_execute(p);
      dVar2 = (double)local_98.fft_size;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      if (0 < number_of_dimensions) {
        lVar16 = 0;
        do {
          *(double *)((long)pdVar1 + lVar16) =
               (*(double *)((long)*local_98.spectrum + lVar16 * 2) *
                *(double *)((long)pdVar6 + lVar16 * 2) -
               *(double *)((long)pdVar6 + lVar16 * 2 + 8) *
               *(double *)((long)*local_98.spectrum + lVar16 * 2 + 8)) / dVar2;
          lVar16 = lVar16 + 8;
        } while (uVar18 << 3 != lVar16);
      }
      operator_delete__(yi);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar17);
  }
  DestroyForwardRealFFT(&local_98);
  operator_delete__(pdVar6);
  operator_delete__(y);
  operator_delete__(x);
  operator_delete__(xi);
  return;
}

Assistant:

void CodeSpectralEnvelope(const double * const *spectrogram, int f0_length,
    int fs, int fft_size, int number_of_dimensions,
    double **coded_spectral_envelope) {
  double *mel_axis = new double[fft_size / 2];
  double *frequency_axis = new double[fft_size / 2 + 1];
  double *tmp_spectrum = new double[fft_size / 2 + 1];
  fft_complex *weight = new fft_complex[fft_size / 2];

  // Generation of the required parameters
  GetParametersForCoding(world::kFloorFrequency,
      MyMinDouble(fs / 2.0, world::kCeilFrequency), fs, fft_size,
      mel_axis, frequency_axis, weight);

  ForwardRealFFT forward_real_fft = { 0 };
  InitializeForwardRealFFT(fft_size / 2, &forward_real_fft);

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      tmp_spectrum[j] = log(spectrogram[i][j]);
    CodeOneFrame(tmp_spectrum, frequency_axis, fft_size, mel_axis, weight,
        fft_size / 2, number_of_dimensions, &forward_real_fft,
        coded_spectral_envelope[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] weight;
  delete[] tmp_spectrum;
  delete[] frequency_axis;
  delete[] mel_axis;
}